

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inet_address_impl.c
# Opt level: O3

cio_error cio_init_inet_address
                    (cio_inet_address *inet_address,uint8_t *address,size_t address_length)

{
  undefined8 uVar1;
  cio_error cVar2;
  
  cVar2 = CIO_INVALID_ARGUMENT;
  if ((inet_address != (cio_inet_address *)0x0) && (address != (uint8_t *)0x0)) {
    if (address_length == 0x10) {
      (inet_address->impl).family = CIO_ADDRESS_FAMILY_INET6;
      uVar1 = *(undefined8 *)(address + 8);
      *(undefined8 *)&(inet_address->impl).field_1 = *(undefined8 *)address;
      *(undefined8 *)((long)&(inet_address->impl).field_1 + 8) = uVar1;
    }
    else {
      if (address_length != 4) {
        return CIO_INVALID_ARGUMENT;
      }
      (inet_address->impl).family = CIO_ADDRESS_FAMILY_INET4;
      (inet_address->impl).field_1.in.s_addr = *(in_addr_t *)address;
    }
    cVar2 = CIO_SUCCESS;
  }
  return cVar2;
}

Assistant:

enum cio_error cio_init_inet_address(struct cio_inet_address *inet_address, const uint8_t *address, size_t address_length)
{
	size_t v4_size = sizeof(inet_address->impl.in.s_addr);
	size_t v6_size = sizeof(inet_address->impl.in6.s6_addr);
	if (cio_unlikely((inet_address == NULL) || (address == NULL) || ((address_length != v4_size) && (address_length != v6_size)))) {
		return CIO_INVALID_ARGUMENT;
	}

	if (address_length == v4_size) {
		inet_address->impl.family = CIO_ADDRESS_FAMILY_INET4;
		memcpy(&inet_address->impl.in.s_addr, address, address_length);
	} else {
		inet_address->impl.family = CIO_ADDRESS_FAMILY_INET6;
		memcpy(&inet_address->impl.in6.s6_addr, address, address_length);
	}

	return CIO_SUCCESS;
}